

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm_sse2.c
# Opt level: O3

void av1_lowbd_fwd_txfm2d_32x16_sse2
               (int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  int32_t *piVar1;
  byte bVar2;
  undefined8 uVar3;
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  undefined1 auVar9 [12];
  undefined1 auVar10 [12];
  undefined1 auVar11 [12];
  int8_t *piVar12;
  bool bVar13;
  int16_t *piVar14;
  uint uVar15;
  undefined7 in_register_00000009;
  long lVar16;
  bool bVar17;
  long lVar18;
  ulong uVar19;
  undefined8 *puVar20;
  undefined4 uVar21;
  undefined1 auVar23 [12];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined4 uVar29;
  undefined1 auVar31 [12];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar45 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar55 [16];
  undefined1 auVar59 [16];
  undefined4 uVar60;
  undefined1 auVar62 [12];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar73 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined4 uVar78;
  undefined1 auVar80 [12];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar88 [16];
  __m128i buf0 [32];
  __m128i buf1 [64];
  code *local_648 [2];
  undefined8 local_638 [2];
  undefined2 local_628;
  undefined2 uStack_626;
  undefined2 uStack_624;
  undefined2 uStack_622;
  undefined2 uStack_620;
  undefined2 uStack_61e;
  undefined2 uStack_61c;
  undefined2 uStack_61a;
  undefined1 local_618 [16];
  undefined2 local_608;
  undefined2 uStack_606;
  undefined2 uStack_604;
  undefined2 uStack_602;
  undefined2 uStack_600;
  undefined2 uStack_5fe;
  undefined2 uStack_5fc;
  undefined2 uStack_5fa;
  undefined1 local_5f8 [16];
  undefined2 local_5e8;
  undefined2 uStack_5e6;
  undefined2 uStack_5e4;
  undefined2 uStack_5e2;
  undefined2 uStack_5e0;
  undefined2 uStack_5de;
  undefined2 uStack_5dc;
  undefined2 uStack_5da;
  undefined1 local_5d8 [16];
  undefined2 local_5c8;
  undefined2 uStack_5c6;
  undefined2 uStack_5c4;
  undefined2 uStack_5c2;
  undefined2 uStack_5c0;
  undefined2 uStack_5be;
  undefined2 uStack_5bc;
  undefined2 uStack_5ba;
  undefined1 local_5b8 [16];
  undefined2 local_5a8;
  undefined2 uStack_5a6;
  undefined2 uStack_5a4;
  undefined2 uStack_5a2;
  undefined2 uStack_5a0;
  undefined2 uStack_59e;
  undefined2 uStack_59c;
  undefined2 uStack_59a;
  undefined1 local_598 [16];
  undefined2 local_588;
  undefined2 uStack_586;
  undefined2 uStack_584;
  undefined2 uStack_582;
  undefined2 uStack_580;
  undefined2 uStack_57e;
  undefined2 uStack_57c;
  undefined2 uStack_57a;
  undefined1 local_578 [16];
  undefined2 local_568;
  undefined2 uStack_566;
  undefined2 uStack_564;
  undefined2 uStack_562;
  undefined2 uStack_560;
  undefined2 uStack_55e;
  undefined2 uStack_55c;
  undefined2 uStack_55a;
  undefined1 local_558 [16];
  undefined2 local_548;
  undefined2 uStack_546;
  undefined2 uStack_544;
  undefined2 uStack_542;
  undefined2 uStack_540;
  undefined2 uStack_53e;
  undefined2 uStack_53c;
  undefined2 uStack_53a;
  undefined8 local_438 [4];
  undefined8 uStack_418;
  undefined4 auStack_410 [6];
  undefined8 uStack_3f8;
  undefined8 auStack_3f0 [3];
  undefined8 uStack_3d8;
  undefined4 auStack_3d0 [102];
  undefined8 local_238 [4];
  undefined1 auStack_218 [16];
  undefined8 auStack_208 [6];
  undefined1 auStack_1d8 [16];
  undefined8 auStack_1c8 [51];
  undefined1 auVar22 [12];
  undefined1 auVar30 [12];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar38 [16];
  undefined1 auVar42 [16];
  undefined1 auVar46 [16];
  undefined1 auVar43 [16];
  undefined1 auVar47 [16];
  undefined1 auVar44 [16];
  undefined1 auVar48 [16];
  undefined1 auVar52 [16];
  undefined1 auVar56 [16];
  undefined1 auVar53 [16];
  undefined1 auVar57 [16];
  undefined1 auVar54 [16];
  undefined1 auVar58 [16];
  undefined1 auVar61 [12];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar71 [16];
  undefined1 auVar74 [16];
  undefined1 auVar72 [16];
  undefined1 auVar75 [16];
  undefined1 auVar79 [12];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar86 [16];
  undefined1 auVar89 [16];
  undefined1 auVar87 [16];
  undefined1 auVar90 [16];
  
  piVar12 = av1_fwd_txfm_shift_ls[10];
  if ((0xe01UL >> ((ulong)tx_type & 0x3f) & 1) != 0) {
    uVar19 = (ulong)(uint)((int)CONCAT71(in_register_00000009,tx_type) << 3);
    local_648[0] = *(code **)((long)col_txfm8x16_arr + uVar19);
    local_648[1] = *(code **)((long)row_txfm8x32_arr + uVar19);
    lVar18 = 0;
    do {
      if ((0xbeafU >> (tx_type & 0x1f) & 1) == 0 && tx_type < 0x10) {
        lVar16 = 0x100;
        piVar14 = input;
        do {
          uVar3 = *(undefined8 *)(piVar14 + 4);
          *(undefined8 *)((long)local_648 + lVar16) = *(undefined8 *)piVar14;
          *(undefined8 *)((long)local_648 + lVar16 + 8) = uVar3;
          piVar14 = piVar14 + stride;
          lVar16 = lVar16 + -0x10;
        } while (lVar16 != 0);
      }
      else {
        lVar16 = 0;
        piVar14 = input;
        do {
          uVar3 = *(undefined8 *)(piVar14 + 4);
          *(undefined8 *)((long)local_638 + lVar16) = *(undefined8 *)piVar14;
          *(undefined8 *)((long)local_638 + lVar16 + 8) = uVar3;
          lVar16 = lVar16 + 0x10;
          piVar14 = piVar14 + stride;
        } while (lVar16 != 0x100);
      }
      bVar2 = *piVar12;
      uVar15 = (uint)(char)bVar2;
      if ((int)uVar15 < 0) {
        auVar24 = ZEXT416((uint)(1 << (~bVar2 & 0x1f)));
        auVar24 = pshuflw(auVar24,auVar24,0);
        auVar24._4_4_ = auVar24._0_4_;
        auVar24._8_4_ = auVar24._0_4_;
        auVar24._12_4_ = auVar24._0_4_;
        lVar16 = 0;
        do {
          auVar40 = paddsw(*(undefined1 (*) [16])((long)local_638 + lVar16),auVar24);
          auVar40 = psraw(auVar40,ZEXT416(-uVar15));
          *(undefined1 (*) [16])((long)local_638 + lVar16) = auVar40;
          lVar16 = lVar16 + 0x10;
        } while (lVar16 != 0x100);
      }
      else if (bVar2 != 0) {
        lVar16 = 0;
        do {
          auVar24 = psllw(*(undefined1 (*) [16])((long)local_638 + lVar16),ZEXT416(uVar15));
          *(undefined1 (*) [16])((long)local_638 + lVar16) = auVar24;
          lVar16 = lVar16 + 0x10;
        } while (lVar16 != 0x100);
      }
      (*local_648[0])(local_638,local_638,0xd);
      bVar2 = piVar12[1];
      uVar15 = (uint)(char)bVar2;
      if ((int)uVar15 < 0) {
        auVar24 = ZEXT416((uint)(1 << (~bVar2 & 0x1f)));
        auVar24 = pshuflw(auVar24,auVar24,0);
        auVar40._0_4_ = auVar24._0_4_;
        auVar40._4_4_ = auVar40._0_4_;
        auVar40._8_4_ = auVar40._0_4_;
        auVar40._12_4_ = auVar40._0_4_;
        lVar16 = 0;
        do {
          auVar24 = paddsw(*(undefined1 (*) [16])((long)local_638 + lVar16),auVar40);
          auVar24 = psraw(auVar24,ZEXT416(-uVar15));
          *(undefined1 (*) [16])((long)local_638 + lVar16) = auVar24;
          lVar16 = lVar16 + 0x10;
        } while (lVar16 != 0x100);
      }
      else if (bVar2 != 0) {
        lVar16 = 0;
        do {
          auVar24 = psllw(*(undefined1 (*) [16])((long)local_638 + lVar16),ZEXT416(uVar15));
          *(undefined1 (*) [16])((long)local_638 + lVar16) = auVar24;
          lVar16 = lVar16 + 0x10;
        } while (lVar16 != 0x100);
      }
      lVar16 = lVar18 * 0x80;
      auVar44._0_12_ = local_638._0_12_;
      auVar44._12_2_ = local_638[0]._6_2_;
      auVar44._14_2_ = uStack_622;
      auVar43._12_4_ = auVar44._12_4_;
      auVar43._0_10_ = local_638._0_10_;
      auVar43._10_2_ = uStack_624;
      auVar42._10_6_ = auVar43._10_6_;
      auVar42._0_8_ = local_638[0];
      auVar42._8_2_ = local_638[0]._4_2_;
      auVar4._4_8_ = auVar42._8_8_;
      auVar4._2_2_ = uStack_626;
      auVar4._0_2_ = local_638[0]._2_2_;
      auVar41._0_4_ = CONCAT22(local_628,(short)local_638[0]);
      auVar41._4_12_ = auVar4;
      auVar72._0_12_ = local_618._0_12_;
      auVar72._12_2_ = local_618._6_2_;
      auVar72._14_2_ = uStack_602;
      auVar71._12_4_ = auVar72._12_4_;
      auVar71._0_10_ = local_618._0_10_;
      auVar71._10_2_ = uStack_604;
      auVar70._10_6_ = auVar71._10_6_;
      auVar70._0_8_ = local_618._0_8_;
      auVar70._8_2_ = local_618._4_2_;
      auVar5._4_8_ = auVar70._8_8_;
      auVar5._2_2_ = uStack_606;
      auVar5._0_2_ = local_618._2_2_;
      auVar54._0_12_ = local_5f8._0_12_;
      auVar54._12_2_ = local_5f8._6_2_;
      auVar54._14_2_ = uStack_5e2;
      auVar53._12_4_ = auVar54._12_4_;
      auVar53._0_10_ = local_5f8._0_10_;
      auVar53._10_2_ = uStack_5e4;
      auVar52._10_6_ = auVar53._10_6_;
      auVar52._0_8_ = local_5f8._0_8_;
      auVar52._8_2_ = local_5f8._4_2_;
      auVar6._4_8_ = auVar52._8_8_;
      auVar6._2_2_ = uStack_5e6;
      auVar6._0_2_ = local_5f8._2_2_;
      auVar51._0_4_ = CONCAT22(local_5e8,local_5f8._0_2_);
      auVar51._4_12_ = auVar6;
      auVar87._0_12_ = local_5d8._0_12_;
      auVar87._12_2_ = local_5d8._6_2_;
      auVar87._14_2_ = uStack_5c2;
      auVar86._12_4_ = auVar87._12_4_;
      auVar86._0_10_ = local_5d8._0_10_;
      auVar86._10_2_ = uStack_5c4;
      auVar85._10_6_ = auVar86._10_6_;
      auVar85._0_8_ = local_5d8._0_8_;
      auVar85._8_2_ = local_5d8._4_2_;
      auVar7._4_8_ = auVar85._8_8_;
      auVar7._2_2_ = uStack_5c6;
      auVar7._0_2_ = local_5d8._2_2_;
      uVar21 = CONCAT22(uStack_620,(short)local_638[1]);
      auVar22._0_8_ = CONCAT26(uStack_61e,CONCAT24(local_638[1]._2_2_,uVar21));
      auVar22._8_2_ = local_638[1]._4_2_;
      auVar22._10_2_ = uStack_61c;
      auVar26._12_2_ = local_638[1]._6_2_;
      auVar26._0_12_ = auVar22;
      auVar26._14_2_ = uStack_61a;
      uVar60 = CONCAT22(uStack_600,local_618._8_2_);
      auVar61._0_8_ = CONCAT26(uStack_5fe,CONCAT24(local_618._10_2_,uVar60));
      auVar61._8_2_ = local_618._12_2_;
      auVar61._10_2_ = uStack_5fc;
      auVar63._12_2_ = local_618._14_2_;
      auVar63._0_12_ = auVar61;
      auVar63._14_2_ = uStack_5fa;
      uVar29 = CONCAT22(uStack_5e0,local_5f8._8_2_);
      auVar30._0_8_ = CONCAT26(uStack_5de,CONCAT24(local_5f8._10_2_,uVar29));
      auVar30._8_2_ = local_5f8._12_2_;
      auVar30._10_2_ = uStack_5dc;
      auVar32._12_2_ = local_5f8._14_2_;
      auVar32._0_12_ = auVar30;
      auVar32._14_2_ = uStack_5da;
      uVar78 = CONCAT22(uStack_5c0,local_5d8._8_2_);
      auVar79._0_8_ = CONCAT26(uStack_5be,CONCAT24(local_5d8._10_2_,uVar78));
      auVar79._8_2_ = local_5d8._12_2_;
      auVar79._10_2_ = uStack_5bc;
      auVar81._12_2_ = local_5d8._14_2_;
      auVar81._0_12_ = auVar79;
      auVar81._14_2_ = uStack_5ba;
      auVar66._0_8_ = auVar41._0_8_;
      auVar66._8_4_ = auVar4._0_4_;
      auVar66._12_4_ = auVar5._0_4_;
      auVar68._0_8_ = auVar51._0_8_;
      auVar68._8_4_ = auVar6._0_4_;
      auVar68._12_4_ = auVar7._0_4_;
      auVar76._8_4_ = (int)((ulong)auVar22._0_8_ >> 0x20);
      auVar76._0_8_ = auVar22._0_8_;
      auVar76._12_4_ = (int)((ulong)auVar61._0_8_ >> 0x20);
      auVar83._8_4_ = (int)((ulong)auVar30._0_8_ >> 0x20);
      auVar83._0_8_ = auVar30._0_8_;
      auVar83._12_4_ = (int)((ulong)auVar79._0_8_ >> 0x20);
      local_438[lVar18 * 0x10] = CONCAT44(CONCAT22(local_608,local_618._0_2_),auVar41._0_4_);
      local_438[lVar18 * 0x10 + 1] = CONCAT44(CONCAT22(local_5c8,local_5d8._0_2_),auVar51._0_4_);
      local_438[lVar18 * 0x10 + 2] = auVar66._8_8_;
      (&uStack_418)[lVar18 * 0x10 + -1] = auVar68._8_8_;
      *(int *)(&uStack_418 + lVar18 * 0x10) = auVar42._8_4_;
      *(int *)((long)&uStack_418 + (lVar18 * 0x20 + 1) * 4) = auVar70._8_4_;
      *(int *)(&uStack_418 + lVar18 * 0x10 + 1) = auVar52._8_4_;
      *(int *)((long)&uStack_418 + (lVar18 * 0x20 + 3) * 4) = auVar85._8_4_;
      *(undefined4 *)(&uStack_418 + lVar18 * 0x10 + 3) = auVar43._12_4_;
      *(undefined4 *)((long)&uStack_418 + (lVar18 * 0x20 + 7) * 4) = auVar71._12_4_;
      *(undefined4 *)(&uStack_3f8 + lVar18 * 0x10) = auVar53._12_4_;
      *(undefined4 *)((long)&uStack_3f8 + lVar16 + 4) = auVar86._12_4_;
      (&uStack_3f8)[lVar18 * 0x10] = CONCAT44(uVar60,uVar21);
      auStack_3f0[lVar18 * 0x10] = CONCAT44(uVar78,uVar29);
      auStack_3f0[lVar18 * 0x10 + 1] = auVar76._8_8_;
      (&uStack_3d8)[lVar18 * 0x10 + -1] = auVar83._8_8_;
      *(int *)(&uStack_3d8 + lVar18 * 0x10) = auVar22._8_4_;
      *(int *)((long)&uStack_3d8 + (lVar18 * 0x20 + 1) * 4) = auVar61._8_4_;
      *(int *)(&uStack_3d8 + lVar18 * 0x10 + 1) = auVar30._8_4_;
      *(int *)((long)&uStack_3d8 + (lVar18 * 0x20 + 3) * 4) = auVar79._8_4_;
      *(int *)(&uStack_3d8 + lVar18 * 0x10 + 3) = auVar26._12_4_;
      *(int *)((long)&uStack_3d8 + (lVar18 * 0x20 + 7) * 4) = auVar63._12_4_;
      *(int *)(&uStack_3d8 + lVar18 * 0x10 + 4) = auVar32._12_4_;
      *(int *)((long)&uStack_3d8 + (lVar18 * 0x20 + 9) * 4) = auVar81._12_4_;
      auVar48._0_12_ = local_5b8._0_12_;
      auVar48._12_2_ = local_5b8._6_2_;
      auVar48._14_2_ = uStack_5a2;
      auVar47._12_4_ = auVar48._12_4_;
      auVar47._0_10_ = local_5b8._0_10_;
      auVar47._10_2_ = uStack_5a4;
      auVar46._10_6_ = auVar47._10_6_;
      auVar46._0_8_ = local_5b8._0_8_;
      auVar46._8_2_ = local_5b8._4_2_;
      auVar8._4_8_ = auVar46._8_8_;
      auVar8._2_2_ = uStack_5a6;
      auVar8._0_2_ = local_5b8._2_2_;
      auVar45._0_4_ = CONCAT22(local_5a8,local_5b8._0_2_);
      auVar45._4_12_ = auVar8;
      auVar75._0_12_ = local_598._0_12_;
      auVar75._12_2_ = local_598._6_2_;
      auVar75._14_2_ = uStack_582;
      auVar74._12_4_ = auVar75._12_4_;
      auVar74._0_10_ = local_598._0_10_;
      auVar74._10_2_ = uStack_584;
      auVar73._10_6_ = auVar74._10_6_;
      auVar73._0_8_ = local_598._0_8_;
      auVar73._8_2_ = local_598._4_2_;
      auVar9._4_8_ = auVar73._8_8_;
      auVar9._2_2_ = uStack_586;
      auVar9._0_2_ = local_598._2_2_;
      auVar58._0_12_ = local_578._0_12_;
      auVar58._12_2_ = local_578._6_2_;
      auVar58._14_2_ = uStack_562;
      auVar57._12_4_ = auVar58._12_4_;
      auVar57._0_10_ = local_578._0_10_;
      auVar57._10_2_ = uStack_564;
      auVar56._10_6_ = auVar57._10_6_;
      auVar56._0_8_ = local_578._0_8_;
      auVar56._8_2_ = local_578._4_2_;
      auVar10._4_8_ = auVar56._8_8_;
      auVar10._2_2_ = uStack_566;
      auVar10._0_2_ = local_578._2_2_;
      auVar55._0_4_ = CONCAT22(local_568,local_578._0_2_);
      auVar55._4_12_ = auVar10;
      auVar90._0_12_ = local_558._0_12_;
      auVar90._12_2_ = local_558._6_2_;
      auVar90._14_2_ = uStack_542;
      auVar89._12_4_ = auVar90._12_4_;
      auVar89._0_10_ = local_558._0_10_;
      auVar89._10_2_ = uStack_544;
      auVar88._10_6_ = auVar89._10_6_;
      auVar88._0_8_ = local_558._0_8_;
      auVar88._8_2_ = local_558._4_2_;
      auVar11._4_8_ = auVar88._8_8_;
      auVar11._2_2_ = uStack_546;
      auVar11._0_2_ = local_558._2_2_;
      uVar21 = CONCAT22(uStack_5a0,local_5b8._8_2_);
      auVar23._0_8_ = CONCAT26(uStack_59e,CONCAT24(local_5b8._10_2_,uVar21));
      auVar23._8_2_ = local_5b8._12_2_;
      auVar23._10_2_ = uStack_59c;
      auVar39._12_2_ = local_5b8._14_2_;
      auVar39._0_12_ = auVar23;
      auVar39._14_2_ = uStack_59a;
      uVar60 = CONCAT22(uStack_580,local_598._8_2_);
      auVar62._0_8_ = CONCAT26(uStack_57e,CONCAT24(local_598._10_2_,uVar60));
      auVar62._8_2_ = local_598._12_2_;
      auVar62._10_2_ = uStack_57c;
      auVar64._12_2_ = local_598._14_2_;
      auVar64._0_12_ = auVar62;
      auVar64._14_2_ = uStack_57a;
      uVar29 = CONCAT22(uStack_560,local_578._8_2_);
      auVar31._0_8_ = CONCAT26(uStack_55e,CONCAT24(local_578._10_2_,uVar29));
      auVar31._8_2_ = local_578._12_2_;
      auVar31._10_2_ = uStack_55c;
      auVar33._12_2_ = local_578._14_2_;
      auVar33._0_12_ = auVar31;
      auVar33._14_2_ = uStack_55a;
      uVar78 = CONCAT22(uStack_540,local_558._8_2_);
      auVar80._0_8_ = CONCAT26(uStack_53e,CONCAT24(local_558._10_2_,uVar78));
      auVar80._8_2_ = local_558._12_2_;
      auVar80._10_2_ = uStack_53c;
      auVar82._12_2_ = local_558._14_2_;
      auVar82._0_12_ = auVar80;
      auVar82._14_2_ = uStack_53a;
      auVar67._0_8_ = auVar45._0_8_;
      auVar67._8_4_ = auVar8._0_4_;
      auVar67._12_4_ = auVar9._0_4_;
      auVar69._0_8_ = auVar55._0_8_;
      auVar69._8_4_ = auVar10._0_4_;
      auVar69._12_4_ = auVar11._0_4_;
      auVar77._8_4_ = (int)((ulong)auVar23._0_8_ >> 0x20);
      auVar77._0_8_ = auVar23._0_8_;
      auVar77._12_4_ = (int)((ulong)auVar62._0_8_ >> 0x20);
      auVar84._8_4_ = (int)((ulong)auVar31._0_8_ >> 0x20);
      auVar84._0_8_ = auVar31._0_8_;
      auVar84._12_4_ = (int)((ulong)auVar80._0_8_ >> 0x20);
      auVar49._0_8_ = CONCAT44(auVar73._8_4_,auVar46._8_4_);
      auVar49._8_4_ = auVar47._12_4_;
      auVar49._12_4_ = auVar74._12_4_;
      auVar59._0_8_ = CONCAT44(auVar88._8_4_,auVar56._8_4_);
      auVar59._8_4_ = auVar57._12_4_;
      auVar59._12_4_ = auVar89._12_4_;
      auVar25._0_8_ = CONCAT44(auVar62._8_4_,auVar23._8_4_);
      auVar25._8_4_ = auVar39._12_4_;
      auVar25._12_4_ = auVar64._12_4_;
      auVar34._0_8_ = CONCAT44(auVar80._8_4_,auVar31._8_4_);
      auVar34._8_4_ = auVar33._12_4_;
      auVar34._12_4_ = auVar82._12_4_;
      local_238[lVar18 * 0x10] = CONCAT44(CONCAT22(local_588,local_598._0_2_),auVar45._0_4_);
      local_238[lVar18 * 0x10 + 1] = CONCAT44(CONCAT22(local_548,local_558._0_2_),auVar55._0_4_);
      local_238[lVar18 * 0x10 + 2] = auVar67._8_8_;
      *(long *)(auStack_218 + lVar16 + -8) = auVar69._8_8_;
      auVar65._8_8_ = auVar59._0_8_;
      auVar65._0_8_ = auVar49._0_8_;
      *(undefined1 (*) [16])(auStack_218 + lVar16) = auVar65;
      auStack_208[lVar18 * 0x10] = auVar49._8_8_;
      auStack_208[lVar18 * 0x10 + 1] = auVar59._8_8_;
      auStack_208[lVar18 * 0x10 + 2] = CONCAT44(uVar60,uVar21);
      auStack_208[lVar18 * 0x10 + 3] = CONCAT44(uVar78,uVar29);
      *(long *)(auStack_1d8 + lVar16 + -0x10) = auVar77._8_8_;
      *(long *)(auStack_1d8 + lVar16 + -8) = auVar84._8_8_;
      auVar50._8_8_ = auVar34._0_8_;
      auVar50._0_8_ = auVar25._0_8_;
      *(undefined1 (*) [16])(auStack_1d8 + lVar16) = auVar50;
      auStack_1c8[lVar18 * 0x10] = auVar25._8_8_;
      auStack_1c8[lVar18 * 0x10 + 1] = auVar34._8_8_;
      lVar18 = lVar18 + 1;
      input = input + 8;
    } while (lVar18 != 4);
    lVar18 = 0;
    bVar13 = true;
    do {
      bVar17 = bVar13;
      puVar20 = local_438 + lVar18 * 0x40;
      if ((0x7f1fU >> (tx_type & 0x1f) & 1) == 0 && tx_type < 0x10) {
        lVar16 = 0x200;
        do {
          uVar3 = puVar20[1];
          *(undefined8 *)((long)local_648 + lVar16) = *puVar20;
          *(undefined8 *)((long)local_648 + lVar16 + 8) = uVar3;
          puVar20 = puVar20 + 2;
          lVar16 = lVar16 + -0x10;
        } while (lVar16 != 0);
        puVar20 = local_638;
      }
      (*local_648[1])(puVar20,puVar20,0xd);
      auVar40 = _DAT_0056b5c0;
      auVar24 = _DAT_00568100;
      bVar2 = piVar12[2];
      uVar15 = (uint)(char)bVar2;
      if ((int)uVar15 < 0) {
        auVar26 = ZEXT416((uint)(1 << (~bVar2 & 0x1f)));
        auVar26 = pshuflw(auVar26,auVar26,0);
        auVar27._0_4_ = auVar26._0_4_;
        auVar27._4_4_ = auVar27._0_4_;
        auVar27._8_4_ = auVar27._0_4_;
        auVar27._12_4_ = auVar27._0_4_;
        lVar16 = 0;
        do {
          auVar26 = paddsw(*(undefined1 (*) [16])((long)puVar20 + lVar16),auVar27);
          auVar26 = psraw(auVar26,ZEXT416(-uVar15));
          *(undefined1 (*) [16])((long)puVar20 + lVar16) = auVar26;
          lVar16 = lVar16 + 0x10;
        } while (lVar16 != 0x200);
      }
      else if (bVar2 != 0) {
        lVar16 = 0;
        do {
          auVar26 = psllw(*(undefined1 (*) [16])((long)puVar20 + lVar16),ZEXT416(uVar15));
          *(undefined1 (*) [16])((long)puVar20 + lVar16) = auVar26;
          lVar16 = lVar16 + 0x10;
        } while (lVar16 != 0x200);
      }
      lVar16 = 0;
      do {
        auVar26 = *(undefined1 (*) [16])((long)puVar20 + lVar16);
        auVar38._0_12_ = auVar26._0_12_;
        auVar38._12_2_ = auVar26._6_2_;
        auVar38._14_2_ = auVar24._6_2_;
        auVar37._12_4_ = auVar38._12_4_;
        auVar37._0_10_ = auVar26._0_10_;
        auVar37._10_2_ = auVar24._4_2_;
        auVar36._10_6_ = auVar37._10_6_;
        auVar36._0_8_ = auVar26._0_8_;
        auVar36._8_2_ = auVar26._4_2_;
        auVar35._8_8_ = auVar36._8_8_;
        auVar35._6_2_ = auVar24._2_2_;
        auVar35._4_2_ = auVar26._2_2_;
        auVar35._0_2_ = auVar26._0_2_;
        auVar35._2_2_ = auVar24._0_2_;
        auVar28._2_2_ = 1;
        auVar28._0_2_ = auVar26._8_2_;
        auVar28._4_2_ = auVar26._10_2_;
        auVar28._6_2_ = 1;
        auVar28._8_2_ = auVar26._12_2_;
        auVar28._10_2_ = 1;
        auVar28._12_2_ = auVar26._14_2_;
        auVar28._14_2_ = 1;
        auVar39 = pmaddwd(auVar35,auVar40);
        auVar26 = pmaddwd(auVar28,auVar40);
        piVar1 = output + lVar18 * 8 + lVar16;
        *piVar1 = auVar39._0_4_ >> 0xc;
        piVar1[1] = auVar39._4_4_ >> 0xc;
        piVar1[2] = auVar39._8_4_ >> 0xc;
        piVar1[3] = auVar39._12_4_ >> 0xc;
        piVar1 = output + lVar18 * 8 + lVar16 + 4;
        *piVar1 = auVar26._0_4_ >> 0xc;
        piVar1[1] = auVar26._4_4_ >> 0xc;
        piVar1[2] = auVar26._8_4_ >> 0xc;
        piVar1[3] = auVar26._12_4_ >> 0xc;
        lVar16 = lVar16 + 0x10;
      } while (lVar16 != 0x200);
      lVar18 = 1;
      bVar13 = false;
    } while (bVar17);
    return;
  }
  av1_fwd_txfm2d_32x16_c(input,output,stride,tx_type,bd);
  return;
}

Assistant:

void av1_lowbd_fwd_txfm2d_32x16_sse2(const int16_t *input, int32_t *output,
                                     int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  __m128i buf0[32], buf1[64];
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_32X16];
  const int txw_idx = get_txw_idx(TX_32X16);
  const int txh_idx = get_txh_idx(TX_32X16);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = 32;
  const int height = 16;
  const transform_1d_sse2 col_txfm = col_txfm8x16_arr[tx_type];
  const transform_1d_sse2 row_txfm = row_txfm8x32_arr[tx_type];

  if (col_txfm != NULL && row_txfm != NULL) {
    int ud_flip, lr_flip;
    get_flip_cfg(tx_type, &ud_flip, &lr_flip);

    for (int i = 0; i < 4; i++) {
      if (ud_flip) {
        load_buffer_16bit_to_16bit_flip(input + 8 * i, stride, buf0, height);
      } else {
        load_buffer_16bit_to_16bit(input + 8 * i, stride, buf0, height);
      }
      round_shift_16bit(buf0, height, shift[0]);
      col_txfm(buf0, buf0, cos_bit_col);
      round_shift_16bit(buf0, height, shift[1]);
      transpose_16bit_8x8(buf0, buf1 + 0 * width + 8 * i);
      transpose_16bit_8x8(buf0 + 8, buf1 + 1 * width + 8 * i);
    }

    for (int i = 0; i < 2; i++) {
      __m128i *buf;
      if (lr_flip) {
        buf = buf0;
        flip_buf_sse2(buf1 + width * i, buf, width);
      } else {
        buf = buf1 + width * i;
      }
      row_txfm(buf, buf, cos_bit_row);
      round_shift_16bit(buf, width, shift[2]);
      store_rect_buffer_16bit_to_32bit_w8(buf, output + 8 * i, height, width);
    }
  } else {
    av1_fwd_txfm2d_32x16_c(input, output, stride, tx_type, bd);
  }
}